

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase173::run(TestCase173 *this)

{
  Builder root2;
  Builder root1;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  Builder local_3f0;
  StructBuilder local_3d8;
  StructBuilder local_3b0;
  StructBuilder local_388 [3];
  StructBuilder in_stack_fffffffffffffd00;
  MallocMessageBuilder local_268;
  Maybe<kj::Exception> local_178;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_268,0x400,GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)((long)(local_388 + 1) + 8),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_3b0,&local_268.super_MessageBuilder);
  local_178.ptr.field_1.value.ownFile.content.size_ = (size_t)local_3b0.data;
  local_178.ptr._0_8_ = local_3b0.segment;
  local_178.ptr.field_1.value.ownFile.content.ptr = (char *)local_3b0.capTable;
  PointerBuilder::initStruct(local_388,(PointerBuilder *)&local_178,(StructSize)0x140006);
  MessageBuilder::getRootInternal(&local_3f0,(MessageBuilder *)((long)(local_388 + 1) + 8));
  local_178.ptr.field_1.value.ownFile.content.size_ = (size_t)local_3f0.builder.pointer;
  local_178.ptr._0_8_ = local_3f0.builder.segment;
  local_178.ptr.field_1.value.ownFile.content.ptr = (char *)local_3f0.builder.capTable;
  PointerBuilder::initStruct(&local_3b0,(PointerBuilder *)&local_178,(StructSize)0x140006);
  local_178.ptr.field_1.value.ownFile.content.size_ = (size_t)(local_388[0].pointers + 2);
  local_178.ptr._0_8_ = local_388[0].segment;
  local_178.ptr.field_1.value.ownFile.content.ptr = (char *)local_388[0].capTable;
  PointerBuilder::initStruct(&local_3d8,(PointerBuilder *)&local_178,(StructSize)0x140006);
  initTestMessage((Builder)in_stack_fffffffffffffd00);
  local_3f0.builder.segment = (SegmentBuilder *)&PTR_run_0036c910;
  local_3f0.builder.capTable = (CapTableBuilder *)&local_3b0;
  local_3f0.builder.pointer = (WirePointer *)local_388;
  kj::_::runCatchingExceptions(&local_178,(Runnable *)&local_3f0);
  if (local_178.ptr.isSet == true) {
    kj::Exception::~Exception(&local_178.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[118]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0xb5,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root2.adoptStructField(root1.disownStructField()); }) != nullptr\""
               ,(char (*) [118])
                "failed: expected ::kj::runCatchingExceptions([&]() { root2.adoptStructField(root1.disownStructField()); }) != nullptr"
              );
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)((long)(local_388 + 1) + 8));
  MallocMessageBuilder::~MallocMessageBuilder(&local_268);
  return;
}

Assistant:

TEST(Orphans, NoCrossMessageTransfers) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;
  auto root1 = builder1.initRoot<TestAllTypes>();
  auto root2 = builder2.initRoot<TestAllTypes>();

  initTestMessage(root1.initStructField());

  EXPECT_ANY_THROW(root2.adoptStructField(root1.disownStructField()));
}